

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  _Setprecision _Var2;
  _Setw _Var3;
  ostream *poVar4;
  int passed;
  exception *e;
  boundary_type in_stack_000000bc;
  int *in_stack_000000c0;
  int *in_stack_000000c8;
  string *in_stack_000000d0;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing segment operators");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  segment_operator();
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing word boundary");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  word_boundary();
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing character boundary");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_boundaries(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc);
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing sentence boundary");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_boundaries(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc);
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing line boundary");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_boundaries(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc);
  iVar1 = test_counter - error_counter;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4," tests");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (0 < error_counter) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,error_counter);
    poVar4 = std::operator<<(poVar4," tests");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)&std::cout," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::fixed);
  _Var2 = std::setprecision(1);
  poVar4 = std::operator<<(poVar4,_Var2);
  _Var3 = std::setw(5);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,((double)iVar1 * 100.0) / (double)test_counter);
  poVar4 = std::operator<<(poVar4,"% of tests completed sucsessefully");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return (uint)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        std::cout << "Testing segment operators" << std::endl;
        segment_operator();
        std::cout << "Testing word boundary" << std::endl;
        word_boundary();
        std::cout << "Testing character boundary" << std::endl;
        test_boundaries(character,nones,0,lb::character);
        std::cout << "Testing sentence boundary" << std::endl;
        test_boundaries(sentence1,sentence1a,sentence1b,lb::sentence);
        std::cout << "Testing line boundary" << std::endl;
        test_boundaries(line1,line1a,line1b,lb::line);
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
}